

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::~ForceManager(ForceManager *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  SelectionEvaluator *this_00;
  vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>
  *in_stack_ffffffffffffffe0;
  vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *this_01;
  
  *in_RDI = &PTR__ForceManager_0050a0a8;
  Utils::deletePointers<std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>>
            (in_stack_ffffffffffffffe0);
  pvVar1 = (void *)in_RDI[7];
  if (pvVar1 != (void *)0x0) {
    SwitchingFunction::~SwitchingFunction((SwitchingFunction *)0x312039);
    operator_delete(pvVar1,0x40);
  }
  this_01 = (vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)in_RDI[5];
  if (this_01 != (vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *)0x0) {
    (*(code *)(this_01->
              super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>)
              ._M_impl.super__Vector_impl_data._M_start[1])();
  }
  if ((long *)in_RDI[6] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[6] + 8))();
  }
  this_00 = (SelectionEvaluator *)in_RDI[8];
  if (this_00 != (SelectionEvaluator *)0x0) {
    operator_delete(this_00,8);
  }
  InteractionData::~InteractionData((InteractionData *)this_00);
  SelectionEvaluator::~SelectionEvaluator(this_00);
  SelectionManager::~SelectionManager((SelectionManager *)this_00);
  std::__cxx11::string::~string((string *)(in_RDI + 0x45));
  std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::~vector(this_01);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x31210f);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_01);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_01);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::
  map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
  ::~map((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
          *)0x312175);
  std::
  map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
  ::~map((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
          *)0x312186);
  std::
  map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
  ::~map((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
          *)0x312197);
  std::
  vector<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
  ::~vector((vector<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
             *)this_01);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x3121b6);
  return;
}

Assistant:

ForceManager::~ForceManager() {
    Utils::deletePointers(forceModifiers_);

    delete switcher_;
    delete interactionMan_;
    delete fDecomp_;
    delete thermo;
  }